

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void nn_print_requires(nn_parse_context *ctx,unsigned_long mask)

{
  nn_option *pnVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    pnVar1 = ctx->options;
    if (*(long *)((long)&pnVar1->longname + lVar2) == 0) break;
    if ((*(ulong *)((long)&pnVar1->mask_set + lVar2) & mask) != 0) {
      fprintf(_stderr,"    --%s\n");
      if ((&pnVar1->shortname)[lVar2] != '\0') {
        fprintf(_stderr,"    -%c\n");
      }
    }
    lVar2 = lVar2 + 0x58;
  }
  exit(1);
}

Assistant:

static void nn_print_requires (struct nn_parse_context *ctx, unsigned long mask)
{
    int i;
    struct nn_option *opt;

    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (opt->mask_set & mask) {
            fprintf (stderr, "    --%s\n", opt->longname);
            if (opt->shortname) {
                fprintf (stderr, "    -%c\n", opt->shortname);
            }
        }
    }
    exit (1);
}